

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O2

void google::protobuf::anon_unknown_0::ExpectContainsType
               (FileDescriptorProto *proto,string *type_name)

{
  __type _Var1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar2;
  int i;
  int index;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  
  index = 0;
  do {
    if (*(int *)((long)&proto->field_0 + 0x28) <= index) {
      testing::Message::Message((Message *)&local_30);
      std::operator<<((ostream *)(local_30._M_head_impl + 0x10),"\"");
      std::operator<<((ostream *)(local_30._M_head_impl + 0x10),
                      (string *)
                      ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      std::operator<<((ostream *)(local_30._M_head_impl + 0x10),
                      "\" did not contain expected type \"");
      std::operator<<((ostream *)(local_30._M_head_impl + 0x10),(string *)type_name);
      std::operator<<((ostream *)(local_30._M_head_impl + 0x10),"\".");
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x2b,"Failed");
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_30._M_head_impl ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
      return;
    }
    pVVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                       (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,index);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)(pVVar2->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                            0xfffffffffffffffc),type_name);
    index = index + 1;
  } while (!_Var1);
  return;
}

Assistant:

static void ExpectContainsType(const FileDescriptorProto& proto,
                               const std::string& type_name) {
  for (int i = 0; i < proto.message_type_size(); i++) {
    if (proto.message_type(i).name() == type_name) return;
  }
  ADD_FAILURE() << "\"" << proto.name() << "\" did not contain expected type \""
                << type_name << "\".";
}